

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

int Dar_LibCutMarkMffc(Aig_Man_t *p,Aig_Obj_t *pRoot,int nLeaves,float *pPower)

{
  Dar_Lib_t *pDVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  pDVar1 = s_DarLib;
  uVar7 = 0;
  uVar3 = (ulong)(uint)nLeaves;
  if (nLeaves < 1) {
    uVar3 = uVar7;
  }
  for (; uVar3 * 0x18 - uVar7 != 0; uVar7 = uVar7 + 0x18) {
    uVar4 = *(ulong *)(pDVar1->pDatas->nLats + (uVar7 - 0x15)) & 0xfffffffffffffffe;
    uVar6 = *(ulong *)(uVar4 + 0x18);
    *(ulong *)(uVar4 + 0x18) = uVar6 & 0xffffffff0000003f | (ulong)((int)uVar6 + 0x40U & 0xffffffc0)
    ;
  }
  iVar2 = Aig_NodeMffcLabel(p,pRoot,pPower);
  pDVar1 = s_DarLib;
  for (lVar5 = 0; uVar3 * 0x18 - lVar5 != 0; lVar5 = lVar5 + 0x18) {
    uVar6 = *(ulong *)(pDVar1->pDatas->nLats + lVar5 + -0x15) & 0xfffffffffffffffe;
    uVar7 = *(ulong *)(uVar6 + 0x18);
    *(ulong *)(uVar6 + 0x18) = uVar7 & 0xffffffff0000003f | (ulong)((int)uVar7 - 0x40U & 0xffffffc0)
    ;
  }
  return iVar2;
}

Assistant:

int Dar_LibCutMarkMffc( Aig_Man_t * p, Aig_Obj_t * pRoot, int nLeaves, float * pPower )
{
    int i, nNodes;
    // mark the cut leaves
    for ( i = 0; i < nLeaves; i++ )
        Aig_Regular(s_DarLib->pDatas[i].pFunc)->nRefs++;
    // label MFFC with current ID
    nNodes = Aig_NodeMffcLabel( p, pRoot, pPower );
    // unmark the cut leaves
    for ( i = 0; i < nLeaves; i++ )
        Aig_Regular(s_DarLib->pDatas[i].pFunc)->nRefs--;
    return nNodes;
}